

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

FT_Error TT_Load_Context(TT_ExecContext exec,TT_Face face,TT_Size size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  FT_Size_Metrics *pFVar3;
  FT_Fixed FVar4;
  FT_Fixed FVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  undefined8 uVar8;
  FT_Vector *pFVar9;
  FT_Vector *pFVar10;
  FT_Vector *pFVar11;
  FT_Byte *pFVar12;
  FT_UShort *pFVar13;
  FT_Memory pFVar14;
  FT_UInt FVar15;
  FT_UShort FVar16;
  FT_UShort FVar17;
  undefined4 uVar18;
  FT_F2Dot14 FVar19;
  FT_Short FVar20;
  FT_Short FVar21;
  FT_UShort FVar22;
  undefined6 uVar23;
  FT_Error FVar24;
  long lVar25;
  TT_Size_Metrics *pTVar26;
  TT_GraphicsState *pTVar27;
  TT_Size_Metrics *pTVar28;
  TT_GraphicsState *pTVar29;
  FT_ULong tmp;
  
  exec->face = face;
  exec->size = size;
  FVar15 = size->max_function_defs;
  exec->numFDefs = size->num_function_defs;
  exec->maxFDefs = FVar15;
  FVar15 = size->max_instruction_defs;
  exec->numIDefs = size->num_instruction_defs;
  exec->maxIDefs = FVar15;
  exec->FDefs = size->function_defs;
  exec->IDefs = size->instruction_defs;
  exec->pointSize = size->point_size;
  pTVar26 = &size->ttmetrics;
  pTVar28 = &exec->tt_metrics;
  for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
    pTVar28->x_ratio = pTVar26->x_ratio;
    pTVar26 = (TT_Size_Metrics *)&pTVar26->y_ratio;
    pTVar28 = (TT_Size_Metrics *)&pTVar28->y_ratio;
  }
  pFVar3 = size->metrics;
  (exec->metrics).max_advance = pFVar3->max_advance;
  FVar16 = pFVar3->x_ppem;
  FVar17 = pFVar3->y_ppem;
  uVar18 = *(undefined4 *)&pFVar3->field_0x4;
  FVar4 = pFVar3->x_scale;
  FVar5 = pFVar3->y_scale;
  FVar6 = pFVar3->ascender;
  FVar7 = pFVar3->height;
  (exec->metrics).descender = pFVar3->descender;
  (exec->metrics).height = FVar7;
  (exec->metrics).y_scale = FVar5;
  (exec->metrics).ascender = FVar6;
  (exec->metrics).x_ppem = FVar16;
  (exec->metrics).y_ppem = FVar17;
  *(undefined4 *)&(exec->metrics).field_0x4 = uVar18;
  (exec->metrics).x_scale = FVar4;
  FVar15 = size->max_ins;
  exec->maxFunc = size->max_func;
  exec->maxIns = FVar15;
  for (lVar25 = 0; lVar25 != 0x30; lVar25 = lVar25 + 0x10) {
    puVar1 = (undefined8 *)((long)&size->codeRangeTable[0].base + lVar25);
    uVar8 = puVar1[1];
    puVar2 = (undefined8 *)((long)&exec->codeRangeTable[0].base + lVar25);
    *puVar2 = *puVar1;
    puVar2[1] = uVar8;
  }
  pTVar27 = &size->GS;
  pTVar29 = &exec->GS;
  for (lVar25 = 0xc; lVar25 != 0; lVar25 = lVar25 + -1) {
    FVar16 = pTVar27->rp1;
    FVar17 = pTVar27->rp2;
    FVar19 = (pTVar27->dualVector).x;
    pTVar29->rp0 = pTVar27->rp0;
    pTVar29->rp1 = FVar16;
    pTVar29->rp2 = FVar17;
    (pTVar29->dualVector).x = FVar19;
    pTVar27 = (TT_GraphicsState *)&(pTVar27->dualVector).y;
    pTVar29 = (TT_GraphicsState *)&(pTVar29->dualVector).y;
  }
  exec->cvtSize = size->cvt_size;
  exec->cvt = size->cvt;
  exec->storeSize = size->storage_size;
  exec->storage = size->storage;
  FVar16 = (size->twilight).max_points;
  FVar20 = (size->twilight).max_contours;
  FVar17 = (size->twilight).n_points;
  FVar21 = (size->twilight).n_contours;
  pFVar9 = (size->twilight).org;
  pFVar10 = (size->twilight).cur;
  pFVar11 = (size->twilight).orus;
  pFVar12 = (size->twilight).tags;
  pFVar13 = (size->twilight).contours;
  FVar22 = (size->twilight).first_point;
  uVar23 = *(undefined6 *)&(size->twilight).field_0x3a;
  (exec->twilight).memory = (size->twilight).memory;
  (exec->twilight).max_points = FVar16;
  (exec->twilight).max_contours = FVar20;
  (exec->twilight).n_points = FVar17;
  (exec->twilight).n_contours = FVar21;
  (exec->twilight).org = pFVar9;
  (exec->twilight).cur = pFVar10;
  (exec->twilight).orus = pFVar11;
  (exec->twilight).tags = pFVar12;
  (exec->twilight).contours = pFVar13;
  (exec->twilight).first_point = FVar22;
  *(undefined6 *)&(exec->twilight).field_0x3a = uVar23;
  memset(&exec->zp0,0,0xc0);
  tmp = exec->stackSize;
  FVar24 = Update_Max(exec->memory,&tmp,8,&exec->stack,
                      (ulong)(face->max_profile).maxStackElements + 0x20);
  exec->stackSize = tmp;
  if (FVar24 == 0) {
    tmp = (FT_ULong)exec->glyphSize;
    FVar24 = Update_Max(exec->memory,&tmp,1,&exec->glyphIns,
                        (ulong)(face->max_profile).maxSizeOfInstructions);
    exec->glyphSize = (FT_UInt)tmp;
    if (FVar24 == 0) {
      (exec->pts).n_points = 0;
      (exec->pts).n_contours = 0;
      pFVar9 = (exec->pts).org;
      pFVar10 = (exec->pts).cur;
      pFVar11 = (exec->pts).orus;
      pFVar12 = (exec->pts).tags;
      FVar16 = (exec->pts).first_point;
      uVar23 = *(undefined6 *)&(exec->pts).field_0x3a;
      (exec->zp1).contours = (exec->pts).contours;
      (exec->zp1).first_point = FVar16;
      *(undefined6 *)&(exec->zp1).field_0x3a = uVar23;
      (exec->zp1).orus = pFVar11;
      (exec->zp1).tags = pFVar12;
      (exec->zp1).org = pFVar9;
      (exec->zp1).cur = pFVar10;
      FVar16 = (exec->pts).max_points;
      FVar20 = (exec->pts).max_contours;
      FVar17 = (exec->pts).n_points;
      FVar21 = (exec->pts).n_contours;
      (exec->zp1).memory = (exec->pts).memory;
      (exec->zp1).max_points = FVar16;
      (exec->zp1).max_contours = FVar20;
      (exec->zp1).n_points = FVar17;
      (exec->zp1).n_contours = FVar21;
      pFVar14 = (exec->pts).memory;
      FVar17 = (exec->pts).max_points;
      FVar20 = (exec->pts).max_contours;
      FVar22 = (exec->pts).n_points;
      FVar21 = (exec->pts).n_contours;
      pFVar9 = (exec->pts).org;
      pFVar10 = (exec->pts).cur;
      pFVar11 = (exec->pts).orus;
      pFVar12 = (exec->pts).tags;
      FVar16 = (exec->pts).first_point;
      uVar23 = *(undefined6 *)&(exec->pts).field_0x3a;
      (exec->zp2).contours = (exec->pts).contours;
      (exec->zp2).first_point = FVar16;
      *(undefined6 *)&(exec->zp2).field_0x3a = uVar23;
      (exec->zp2).orus = pFVar11;
      (exec->zp2).tags = pFVar12;
      (exec->zp2).org = pFVar9;
      (exec->zp2).cur = pFVar10;
      (exec->zp2).memory = pFVar14;
      (exec->zp2).max_points = FVar17;
      (exec->zp2).max_contours = FVar20;
      (exec->zp2).n_points = FVar22;
      (exec->zp2).n_contours = FVar21;
      pFVar14 = (exec->pts).memory;
      FVar17 = (exec->pts).max_points;
      FVar20 = (exec->pts).max_contours;
      FVar22 = (exec->pts).n_points;
      FVar21 = (exec->pts).n_contours;
      pFVar9 = (exec->pts).org;
      pFVar10 = (exec->pts).cur;
      pFVar11 = (exec->pts).orus;
      pFVar12 = (exec->pts).tags;
      FVar16 = (exec->pts).first_point;
      uVar23 = *(undefined6 *)&(exec->pts).field_0x3a;
      (exec->zp0).contours = (exec->pts).contours;
      (exec->zp0).first_point = FVar16;
      *(undefined6 *)&(exec->zp0).field_0x3a = uVar23;
      (exec->zp0).orus = pFVar11;
      (exec->zp0).tags = pFVar12;
      (exec->zp0).org = pFVar9;
      (exec->zp0).cur = pFVar10;
      (exec->zp0).memory = pFVar14;
      (exec->zp0).max_points = FVar17;
      (exec->zp0).max_contours = FVar20;
      (exec->zp0).n_points = FVar22;
      (exec->zp0).n_contours = FVar21;
      exec->instruction_trap = '\0';
      FVar24 = 0;
    }
  }
  return FVar24;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Load_Context( TT_ExecContext  exec,
                   TT_Face         face,
                   TT_Size         size )
  {
    FT_Int          i;
    FT_ULong        tmp;
    TT_MaxProfile*  maxp;
    FT_Error        error;


    exec->face = face;
    maxp       = &face->max_profile;
    exec->size = size;

    if ( size )
    {
      exec->numFDefs   = size->num_function_defs;
      exec->maxFDefs   = size->max_function_defs;
      exec->numIDefs   = size->num_instruction_defs;
      exec->maxIDefs   = size->max_instruction_defs;
      exec->FDefs      = size->function_defs;
      exec->IDefs      = size->instruction_defs;
      exec->pointSize  = size->point_size;
      exec->tt_metrics = size->ttmetrics;
      exec->metrics    = *size->metrics;

      exec->maxFunc    = size->max_func;
      exec->maxIns     = size->max_ins;

      for ( i = 0; i < TT_MAX_CODE_RANGES; i++ )
        exec->codeRangeTable[i] = size->codeRangeTable[i];

      /* set graphics state */
      exec->GS = size->GS;

      exec->cvtSize = size->cvt_size;
      exec->cvt     = size->cvt;

      exec->storeSize = size->storage_size;
      exec->storage   = size->storage;

      exec->twilight  = size->twilight;

      /* In case of multi-threading it can happen that the old size object */
      /* no longer exists, thus we must clear all glyph zone references.   */
      FT_ZERO( &exec->zp0 );
      exec->zp1 = exec->zp0;
      exec->zp2 = exec->zp0;
    }

    /* XXX: We reserve a little more elements on the stack to deal safely */
    /*      with broken fonts like arialbs, courbs, timesbs, etc.         */
    tmp = (FT_ULong)exec->stackSize;
    error = Update_Max( exec->memory,
                        &tmp,
                        sizeof ( FT_F26Dot6 ),
                        (void*)&exec->stack,
                        maxp->maxStackElements + 32 );
    exec->stackSize = (FT_Long)tmp;
    if ( error )
      return error;

    tmp = (FT_ULong)exec->glyphSize;
    error = Update_Max( exec->memory,
                        &tmp,
                        sizeof ( FT_Byte ),
                        (void*)&exec->glyphIns,
                        maxp->maxSizeOfInstructions );
    exec->glyphSize = (FT_UInt)tmp;
    if ( error )
      return error;

    exec->pts.n_points   = 0;
    exec->pts.n_contours = 0;

    exec->zp1 = exec->pts;
    exec->zp2 = exec->pts;
    exec->zp0 = exec->pts;

    exec->instruction_trap = FALSE;

    return FT_Err_Ok;
  }